

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

UBool __thiscall icu_63::RuleBasedBreakIterator::BreakCache::seek(BreakCache *this,int32_t pos)

{
  int32_t iVar1;
  int iVar2;
  int local_24;
  int32_t probe;
  int32_t max;
  int32_t min;
  int32_t pos_local;
  BreakCache *this_local;
  
  if ((pos < this->fBoundaries[this->fStartBufIdx]) || (this->fBoundaries[this->fEndBufIdx] < pos))
  {
    this_local._7_1_ = '\0';
  }
  else if (pos == this->fBoundaries[this->fStartBufIdx]) {
    this->fBufIdx = this->fStartBufIdx;
    this->fTextIdx = this->fBoundaries[this->fBufIdx];
    this_local._7_1_ = '\x01';
  }
  else if (pos == this->fBoundaries[this->fEndBufIdx]) {
    this->fBufIdx = this->fEndBufIdx;
    this->fTextIdx = this->fBoundaries[this->fBufIdx];
    this_local._7_1_ = '\x01';
  }
  else {
    probe = this->fStartBufIdx;
    iVar1 = this->fEndBufIdx;
    while (local_24 = iVar1, probe != local_24) {
      iVar2 = 0;
      if (local_24 < probe) {
        iVar2 = 0x80;
      }
      iVar1 = modChunkSize((probe + local_24 + iVar2) / 2);
      if (this->fBoundaries[iVar1] <= pos) {
        probe = modChunkSize(iVar1 + 1);
        iVar1 = local_24;
      }
    }
    iVar1 = modChunkSize(local_24 + -1);
    this->fBufIdx = iVar1;
    this->fTextIdx = this->fBoundaries[this->fBufIdx];
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::seek(int32_t pos) {
    if (pos < fBoundaries[fStartBufIdx] || pos > fBoundaries[fEndBufIdx]) {
        return FALSE;
    }
    if (pos == fBoundaries[fStartBufIdx]) {
        // Common case: seek(0), from BreakIterator::first()
        fBufIdx = fStartBufIdx;
        fTextIdx = fBoundaries[fBufIdx];
        return TRUE;
    }
    if (pos == fBoundaries[fEndBufIdx]) {
        fBufIdx = fEndBufIdx;
        fTextIdx = fBoundaries[fBufIdx];
        return TRUE;
    }

    int32_t min = fStartBufIdx;
    int32_t max = fEndBufIdx;
    while (min != max) {
        int32_t probe = (min + max + (min>max ? CACHE_SIZE : 0)) / 2;
        probe = modChunkSize(probe);
        if (fBoundaries[probe] > pos) {
            max = probe;
        } else {
            min = modChunkSize(probe + 1);
        }
    }
    U_ASSERT(fBoundaries[max] > pos);
    fBufIdx = modChunkSize(max - 1);
    fTextIdx = fBoundaries[fBufIdx];
    U_ASSERT(fTextIdx <= pos);
    return TRUE;
}